

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSTM.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeLSTM(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  bool bVar2;
  int index;
  int iVar3;
  LayerParameter *caffeLayer_00;
  LayerParameter *this;
  string *psVar4;
  mapped_type *pmVar5;
  BlobProto *pBVar6;
  BlobShape *this_00;
  LSTMParams *pLVar7;
  ActivationParams *pAVar8;
  LSTMWeightParams *pLVar9;
  WeightParams *pWVar10;
  NetParameter *in_stack_00000008;
  float local_76c;
  int local_768;
  float local_764;
  int i_11;
  RepeatedField<float> *Rz;
  int local_750;
  float local_74c;
  int i_10;
  RepeatedField<float> *Ro;
  int local_738;
  float local_734;
  int i_9;
  RepeatedField<float> *Rf;
  int local_720;
  float local_71c;
  int i_8;
  RepeatedField<float> *Ri;
  string local_708;
  string local_6e8;
  string local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  float local_624;
  int local_620;
  float local_61c;
  int i_7;
  RepeatedField<float> *bz;
  int local_608;
  float local_604;
  int i_6;
  RepeatedField<float> *bo;
  int local_5f0;
  float local_5ec;
  int i_5;
  RepeatedField<float> *bf;
  int local_5d8;
  float local_5d4;
  int i_4;
  RepeatedField<float> *bi;
  string local_5c0;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  float local_4dc;
  int local_4d8;
  float local_4d4;
  int i_3;
  RepeatedField<float> *Wz;
  int local_4c0;
  float local_4bc;
  int i_2;
  RepeatedField<float> *Wo;
  int local_4a8;
  float local_4a4;
  int i_1;
  RepeatedField<float> *Wf;
  int local_490;
  float local_48c;
  int i;
  RepeatedField<float> *Wi;
  string local_478;
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  long local_398;
  int64_t expectedSize;
  int iStack_388;
  int blobSize;
  int64_t input_size;
  UniDirectionalLSTMLayerParams *specLayerParams;
  string local_370;
  allocator local_349;
  string local_348;
  allocator local_321;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  allocator local_2d1;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator<long> local_259;
  ulong local_258;
  vector<long,_std::allocator<long>_> local_250;
  allocator<long> local_231;
  ulong local_230;
  vector<long,_std::allocator<long>_> local_228;
  uint32 local_20c;
  RecurrentParameter *pRStack_208;
  uint32_t hidden_size;
  RecurrentParameter *caffeLayerParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  string cnameout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string hnameout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string cnamein;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string hnamein;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  
  iVar3 = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  caffeLayer_00 = caffe::NetParameter::layer(in_stack_00000008,iVar3);
  index = getLayerIndex(caffeLayer_00,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)layerParameters.mappingDataBlobNames);
  this = caffe::NetParameter::layer(layerParameters.prototxt,index);
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                           layerParameters.protoweights);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58);
  psVar4 = caffe::LayerParameter::bottom_abi_cxx11_(caffeLayer_00,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58,psVar4);
  std::__cxx11::to_string((string *)((long)&cnamein.field_2 + 8),iVar3);
  std::operator+(&local_a8,"LSTM_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cnamein.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,"_h_in");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)(cnamein.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58,(value_type *)local_88);
  std::__cxx11::to_string
            ((string *)
             &top.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar3);
  std::operator+(&local_108,"LSTM_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &top.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_108,"_c_in");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string
            ((string *)
             &top.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58,(value_type *)local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&hnameout.field_2 + 8));
  psVar4 = caffe::LayerParameter::top_abi_cxx11_(caffeLayer_00,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&hnameout.field_2 + 8),psVar4);
  std::__cxx11::to_string((string *)((long)&cnameout.field_2 + 8),iVar3);
  std::operator+(&local_180,"LSTM_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cnameout.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 &local_180,"_h_out");
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)(cnameout.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&hnameout.field_2 + 8),(value_type *)local_160);
  std::__cxx11::to_string((string *)&caffeLayerParams,iVar3);
  std::operator+(&local_1e0,"LSTM_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &caffeLayerParams);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                 &local_1e0,"_c_out");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&caffeLayerParams);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&hnameout.field_2 + 8),(value_type *)local_1c0);
  psVar4 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer_00);
  convertCaffeMetadata
            (psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&hnameout.field_2 + 8),
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
             layerParameters.protoweights,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)layerParameters._24_8_);
  pRStack_208 = caffe::LayerParameter::recurrent_param(caffeLayer_00);
  local_20c = caffe::RecurrentParameter::num_output(pRStack_208);
  local_230 = (ulong)local_20c;
  std::allocator<long>::allocator(&local_231);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_228,1,(value_type_conflict *)&local_230,&local_231);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                         *)layerParameters.mapCaffeLayerNamesToIndex,(key_type *)local_88);
  std::vector<long,_std::allocator<long>_>::operator=(pmVar5,&local_228);
  std::vector<long,_std::allocator<long>_>::~vector(&local_228);
  std::allocator<long>::~allocator(&local_231);
  local_258 = (ulong)local_20c;
  std::allocator<long>::allocator(&local_259);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_250,1,(value_type_conflict *)&local_258,&local_259);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
                         *)layerParameters.mapCaffeLayerNamesToIndex,(key_type *)local_e8);
  std::vector<long,_std::allocator<long>_>::operator=(pmVar5,&local_250);
  std::vector<long,_std::allocator<long>_>::~vector(&local_250);
  std::allocator<long>::~allocator(&local_259);
  iVar3 = caffe::LayerParameter::blobs_size(this);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_280,"Weights not found in the caffemodel file",&local_281);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"Recurrent",&local_2a9);
    errorInCaffeProto(&local_280,psVar4,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  if (local_20c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2d0,"\'num_output\' cannot be non-positive",&local_2d1);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f8,"Recurrent",&local_2f9);
    errorInCaffeProto(&local_2d0,psVar4,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  }
  bVar2 = caffe::RecurrentParameter::expose_hidden(pRStack_208);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_320,"expose_hidden",&local_321);
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_348,"Recurrent",&local_349);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_370,"True",(allocator *)((long)&specLayerParams + 7));
    unsupportedCaffeParrameterWithOption(&local_320,psVar4,&local_348,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator((allocator<char> *)((long)&specLayerParams + 7));
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
  }
  input_size = (int64_t)CoreML::Specification::NeuralNetworkLayer::mutable_unidirectionallstm
                                  ((NeuralNetworkLayer *)
                                   bottom.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pBVar6 = caffe::LayerParameter::blobs(this,0);
  this_00 = caffe::BlobProto::shape(pBVar6);
  _iStack_388 = caffe::BlobShape::dim(this_00,1);
  CoreML::Specification::UniDirectionalLSTMLayerParams::set_outputvectorsize
            ((UniDirectionalLSTMLayerParams *)input_size,(ulong)local_20c);
  if ((long)_iStack_388 < 0) {
    __assert_fail("input_size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/LSTM.cpp"
                  ,0x4d,
                  "void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters)")
    ;
  }
  CoreML::Specification::UniDirectionalLSTMLayerParams::set_inputvectorsize
            ((UniDirectionalLSTMLayerParams *)input_size,_iStack_388);
  pLVar7 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params
                     ((UniDirectionalLSTMLayerParams *)input_size);
  CoreML::Specification::LSTMParams::set_sequenceoutput(pLVar7,false);
  pLVar7 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params
                     ((UniDirectionalLSTMLayerParams *)input_size);
  CoreML::Specification::LSTMParams::set_forgetbias(pLVar7,false);
  pLVar7 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params
                     ((UniDirectionalLSTMLayerParams *)input_size);
  CoreML::Specification::LSTMParams::set_hasbiasvectors(pLVar7,true);
  pAVar8 = CoreML::Specification::UniDirectionalLSTMLayerParams::add_activations
                     ((UniDirectionalLSTMLayerParams *)input_size);
  CoreML::Specification::ActivationParams::mutable_sigmoid(pAVar8);
  pAVar8 = CoreML::Specification::UniDirectionalLSTMLayerParams::add_activations
                     ((UniDirectionalLSTMLayerParams *)input_size);
  CoreML::Specification::ActivationParams::mutable_tanh(pAVar8);
  pAVar8 = CoreML::Specification::UniDirectionalLSTMLayerParams::add_activations
                     ((UniDirectionalLSTMLayerParams *)input_size);
  CoreML::Specification::ActivationParams::mutable_tanh(pAVar8);
  pBVar6 = caffe::LayerParameter::blobs(this,0);
  expectedSize._4_4_ = caffe::BlobProto::data_size(pBVar6);
  local_398 = (ulong)local_20c * 4 * _iStack_388;
  if (expectedSize._4_4_ != local_398) {
    std::__cxx11::to_string(&local_438,local_398);
    std::operator+(&local_418,"Expected blob size = ",&local_438);
    std::operator+(&local_3f8,&local_418," but found blob of size = ");
    std::__cxx11::to_string(&local_458,expectedSize._4_4_);
    std::operator+(&local_3d8,&local_3f8,&local_458);
    std::operator+(&local_3b8,&local_3d8," in caffe");
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_478,"Recurrent",(allocator *)((long)&Wi + 7));
    errorInCaffeProto(&local_3b8,psVar4,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator((allocator<char> *)((long)&Wi + 7));
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_inputgateweightmatrix(pLVar9);
  _i = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_48c = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i,iVar3 >> 2,&local_48c);
  for (local_490 = 0; pRVar1 = _i, iVar3 = local_490, local_490 < expectedSize._4_4_ / 4;
      local_490 = local_490 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,0);
    Wf._4_4_ = caffe::BlobProto::data(pBVar6,local_490);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&Wf + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_forgetgateweightmatrix(pLVar9);
  _i_1 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_4a4 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_1,iVar3 >> 2,&local_4a4);
  for (local_4a8 = 0; pRVar1 = _i_1, iVar3 = local_4a8, local_4a8 < expectedSize._4_4_ / 4;
      local_4a8 = local_4a8 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,0);
    Wo._4_4_ = caffe::BlobProto::data(pBVar6,local_4a8 + local_20c * iStack_388);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&Wo + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_outputgateweightmatrix(pLVar9);
  _i_2 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_4bc = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_2,iVar3 >> 2,&local_4bc);
  for (local_4c0 = 0; pRVar1 = _i_2, iVar3 = local_4c0, local_4c0 < expectedSize._4_4_ / 4;
      local_4c0 = local_4c0 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,0);
    Wz._4_4_ = caffe::BlobProto::data(pBVar6,local_4c0 + local_20c * iStack_388 * 2);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&Wz + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_blockinputweightmatrix(pLVar9);
  _i_3 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_4d4 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_3,iVar3 >> 2,&local_4d4);
  for (local_4d8 = 0; pRVar1 = _i_3, iVar3 = local_4d8, local_4d8 < expectedSize._4_4_ / 4;
      local_4d8 = local_4d8 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,0);
    local_4dc = caffe::BlobProto::data(pBVar6,local_4d8 + local_20c * iStack_388 * 3);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,&local_4dc);
  }
  pBVar6 = caffe::LayerParameter::blobs(this,1);
  expectedSize._4_4_ = caffe::BlobProto::data_size(pBVar6);
  local_398 = (ulong)local_20c << 2;
  if (expectedSize._4_4_ != local_398) {
    std::__cxx11::to_string(&local_580,local_398);
    std::operator+(&local_560,"Expected blob size = ",&local_580);
    std::operator+(&local_540,&local_560," but found blob of size = ");
    std::__cxx11::to_string(&local_5a0,expectedSize._4_4_);
    std::operator+(&local_520,&local_540,&local_5a0);
    std::operator+(&local_500,&local_520," in caffe");
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c0,"Recurrent",(allocator *)((long)&bi + 7));
    errorInCaffeProto(&local_500,psVar4,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&bi + 7));
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_580);
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_inputgatebiasvector(pLVar9);
  _i_4 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_5d4 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_4,iVar3 >> 2,&local_5d4);
  for (local_5d8 = 0; pRVar1 = _i_4, iVar3 = local_5d8, local_5d8 < expectedSize._4_4_ / 4;
      local_5d8 = local_5d8 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,1);
    bf._4_4_ = caffe::BlobProto::data(pBVar6,local_5d8);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&bf + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_forgetgatebiasvector(pLVar9);
  _i_5 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_5ec = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_5,iVar3 >> 2,&local_5ec);
  for (local_5f0 = 0; pRVar1 = _i_5, iVar3 = local_5f0, local_5f0 < expectedSize._4_4_ / 4;
      local_5f0 = local_5f0 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,1);
    bo._4_4_ = caffe::BlobProto::data(pBVar6,local_5f0 + local_20c);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&bo + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_outputgatebiasvector(pLVar9);
  _i_6 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_604 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_6,iVar3 >> 2,&local_604);
  for (local_608 = 0; pRVar1 = _i_6, iVar3 = local_608, local_608 < expectedSize._4_4_ / 4;
      local_608 = local_608 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,1);
    bz._4_4_ = caffe::BlobProto::data(pBVar6,local_608 + local_20c * 2);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&bz + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_blockinputbiasvector(pLVar9);
  _i_7 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_61c = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_7,iVar3 >> 2,&local_61c);
  for (local_620 = 0; pRVar1 = _i_7, iVar3 = local_620, local_620 < expectedSize._4_4_ / 4;
      local_620 = local_620 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,1);
    local_624 = caffe::BlobProto::data(pBVar6,local_620 + local_20c * 3);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,&local_624);
  }
  pBVar6 = caffe::LayerParameter::blobs(this,2);
  expectedSize._4_4_ = caffe::BlobProto::data_size(pBVar6);
  local_398 = (ulong)local_20c * 4 * (ulong)local_20c;
  if (expectedSize._4_4_ != local_398) {
    std::__cxx11::to_string(&local_6c8,local_398);
    std::operator+(&local_6a8,"Expected blob size = ",&local_6c8);
    std::operator+(&local_688,&local_6a8," but found blob of size = ");
    std::__cxx11::to_string(&local_6e8,expectedSize._4_4_);
    std::operator+(&local_668,&local_688,&local_6e8);
    std::operator+(&local_648,&local_668," in caffe");
    psVar4 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_708,"Recurrent",(allocator *)((long)&Ri + 7));
    errorInCaffeProto(&local_648,psVar4,&local_708);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator((allocator<char> *)((long)&Ri + 7));
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&local_6c8);
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_inputgaterecursionmatrix(pLVar9);
  _i_8 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_71c = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_8,iVar3 >> 2,&local_71c);
  for (local_720 = 0; pRVar1 = _i_8, iVar3 = local_720, local_720 < expectedSize._4_4_ / 4;
      local_720 = local_720 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,2);
    Rf._4_4_ = caffe::BlobProto::data(pBVar6,local_720);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&Rf + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_forgetgaterecursionmatrix(pLVar9);
  _i_9 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_734 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_9,iVar3 >> 2,&local_734);
  for (local_738 = 0; pRVar1 = _i_9, iVar3 = local_738, local_738 < expectedSize._4_4_ / 4;
      local_738 = local_738 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,2);
    Ro._4_4_ = caffe::BlobProto::data(pBVar6,local_738 + local_20c * local_20c);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&Ro + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_outputgaterecursionmatrix(pLVar9);
  _i_10 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_74c = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_10,iVar3 >> 2,&local_74c);
  for (local_750 = 0; pRVar1 = _i_10, iVar3 = local_750, local_750 < expectedSize._4_4_ / 4;
      local_750 = local_750 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,2);
    Rz._4_4_ = caffe::BlobProto::data(pBVar6,local_750 + local_20c * local_20c * 2);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,(float *)((long)&Rz + 4));
  }
  pLVar9 = CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
                     ((UniDirectionalLSTMLayerParams *)input_size);
  pWVar10 = CoreML::Specification::LSTMWeightParams::mutable_blockinputrecursionmatrix(pLVar9);
  _i_11 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  iVar3 = expectedSize._4_4_;
  if (expectedSize._4_4_ < 0) {
    iVar3 = expectedSize._4_4_ + 3;
  }
  local_764 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(_i_11,iVar3 >> 2,&local_764);
  for (local_768 = 0; pRVar1 = _i_11, iVar3 = local_768, local_768 < expectedSize._4_4_ / 4;
      local_768 = local_768 + 1) {
    pBVar6 = caffe::LayerParameter::blobs(this,2);
    local_76c = caffe::BlobProto::data(pBVar6,local_768 + local_20c * local_20c * 3);
    google::protobuf::RepeatedField<float>::Set(pRVar1,iVar3,&local_76c);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&hnameout.field_2 + 8));
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;

    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    // Caffe LSTM layers take an extra input, a binary indicator to show where one input sequence
    // ends and the next begins in order to reset the hidden state for this occurrence.
    // Since we don't support this, we need to ignore this input
    bottom.push_back(caffeLayer.bottom(0));
    // Now, we need to add the addtional hidden inputs and outputs
    std::string hnamein = "LSTM_" + std::to_string(layerId) + "_h_in";
    bottom.push_back(hnamein);
    std::string cnamein = "LSTM_" + std::to_string(layerId) + "_c_in";
    bottom.push_back(cnamein);
    
    // Same deal for top names
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    std::string hnameout = "LSTM_" + std::to_string(layerId) + "_h_out";
    top.push_back(hnameout);
    std::string cnameout = "LSTM_" + std::to_string(layerId) + "_c_out";
    top.push_back(cnameout);
    
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::RecurrentParameter& caffeLayerParams = caffeLayer.recurrent_param();
    uint32_t hidden_size = caffeLayerParams.num_output();
    layerParameters.mapBlobNameToDimensions[hnamein] = std::vector<int64_t>(1, hidden_size);
    layerParameters.mapBlobNameToDimensions[cnamein] = std::vector<int64_t>(1, hidden_size);
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()==0){
        CoreMLConverter::errorInCaffeProto("Weights not found in the caffemodel file", caffeLayer.name(), "Recurrent");
    }
    if (hidden_size<=0) {
        CoreMLConverter::errorInCaffeProto("'num_output' cannot be non-positive",caffeLayer.name(),"Recurrent");
    }
    if (caffeLayerParams.expose_hidden()) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("expose_hidden",caffeLayer.name(),"Recurrent","True");
    }
    //**************************************************************

    Specification::UniDirectionalLSTMLayerParams* specLayerParams = specLayer->mutable_unidirectionallstm();

    // Caffe is stored input, bias, Hidden
    int64_t input_size = caffeLayerWeights.blobs(0).shape().dim(1);

    specLayerParams->set_outputvectorsize(static_cast<uint64_t>(hidden_size));
    assert(input_size >= 0);
    specLayerParams->set_inputvectorsize(static_cast<uint64_t>(input_size));
    
    specLayerParams->mutable_params()->set_sequenceoutput(false);
    // Caffe doesn't support forget bias, so it won't come up
    specLayerParams->mutable_params()->set_forgetbias(false);
    specLayerParams->mutable_params()->set_hasbiasvectors(true);
    
    //Add default set of non-linearities
    specLayerParams->add_activations()->mutable_sigmoid();
    specLayerParams->add_activations()->mutable_tanh();
    specLayerParams->add_activations()->mutable_tanh();
    
    //Copy weights
    //Input Weight Matrices
    int blobSize = caffeLayerWeights.blobs(0).data_size();
    int64_t expectedSize = 4*((int64_t)hidden_size)*input_size;
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    
    ::google::protobuf::RepeatedField<float>* Wi = specLayerParams->mutable_weightparams()->mutable_inputgateweightmatrix()->mutable_floatvalue();
    Wi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wi->Set(i,caffeLayerWeights.blobs(0).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Wf = specLayerParams->mutable_weightparams()->mutable_forgetgateweightmatrix()->mutable_floatvalue();
    Wf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wf->Set(i,caffeLayerWeights.blobs(0).data(i + static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wo = specLayerParams->mutable_weightparams()->mutable_outputgateweightmatrix()->mutable_floatvalue();
    Wo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wo->Set(i,caffeLayerWeights.blobs(0).data(i + 2*static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wz = specLayerParams->mutable_weightparams()->mutable_blockinputweightmatrix()->mutable_floatvalue();
    Wz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wz->Set(i,caffeLayerWeights.blobs(0).data(i + 3*static_cast<int>(hidden_size*input_size)));
    }
    
    //biases
    blobSize = caffeLayerWeights.blobs(1).data_size();
    expectedSize = 4*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* bi = specLayerParams->mutable_weightparams()->mutable_inputgatebiasvector()->mutable_floatvalue();
    bi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bi->Set(i,caffeLayerWeights.blobs(1).data(i));
    }
    ::google::protobuf::RepeatedField<float>* bf = specLayerParams->mutable_weightparams()->mutable_forgetgatebiasvector()->mutable_floatvalue();
    bf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bf->Set(i,caffeLayerWeights.blobs(1).data(i + static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bo = specLayerParams->mutable_weightparams()->mutable_outputgatebiasvector()->mutable_floatvalue();
    bo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bo->Set(i,caffeLayerWeights.blobs(1).data(i + 2*static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bz = specLayerParams->mutable_weightparams()->mutable_blockinputbiasvector()->mutable_floatvalue();
    bz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bz->Set(i,caffeLayerWeights.blobs(1).data(i + 3*static_cast<int>(hidden_size)));
    }
    
    
    //Recursion matrices
    blobSize = caffeLayerWeights.blobs(2).data_size();
    expectedSize = 4*((int64_t)hidden_size)*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* Ri = specLayerParams->mutable_weightparams()->mutable_inputgaterecursionmatrix()->mutable_floatvalue();
    Ri->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ri->Set(i,caffeLayerWeights.blobs(2).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Rf = specLayerParams->mutable_weightparams()->mutable_forgetgaterecursionmatrix()->mutable_floatvalue();
    Rf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rf->Set(i,caffeLayerWeights.blobs(2).data(i + static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Ro = specLayerParams->mutable_weightparams()->mutable_outputgaterecursionmatrix()->mutable_floatvalue();
    Ro->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ro->Set(i,caffeLayerWeights.blobs(2).data(i + 2*static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Rz = specLayerParams->mutable_weightparams()->mutable_blockinputrecursionmatrix()->mutable_floatvalue();
    Rz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rz->Set(i,caffeLayerWeights.blobs(2).data(i + 3*static_cast<int>(hidden_size*hidden_size)));
    }
}